

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

ImGuiTableSettings * ImGui::TableSettingsCreate(ImGuiID id,int columns_count)

{
  ImGuiTableSettings *pIVar1;
  int in_ESI;
  ImGuiTableSettings *settings;
  ImGuiContext *g;
  size_t in_stack_ffffffffffffffe8;
  ImGuiContext *this;
  
  this = GImGui;
  TableSettingsCalcChunkSize(in_ESI);
  pIVar1 = ImChunkStream<ImGuiTableSettings>::alloc_chunk
                     ((ImChunkStream<ImGuiTableSettings> *)this,in_stack_ffffffffffffffe8);
  TableSettingsInit((ImGuiTableSettings *)CONCAT44(id,columns_count),g._4_4_,(int)g,settings._4_4_);
  return pIVar1;
}

Assistant:

ImGuiTableSettings* ImGui::TableSettingsCreate(ImGuiID id, int columns_count)
{
    ImGuiContext& g = *GImGui;
    ImGuiTableSettings* settings = g.SettingsTables.alloc_chunk(TableSettingsCalcChunkSize(columns_count));
    TableSettingsInit(settings, id, columns_count, columns_count);
    return settings;
}